

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall WebSocketsession::do_read(WebSocketsession *this)

{
  shared_ptr<WebSocketsession> *args;
  offset_in_WebSocketsession_to_subr *handler;
  long in_RDI;
  enable_shared_from_this<WebSocketsession> *in_stack_ffffffffffffff88;
  bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
  *handler_00;
  basic_flat_buffer<std::allocator<char>_> *in_stack_ffffffffffffffa8;
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
  *in_stack_ffffffffffffffb0;
  bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
  local_48 [2];
  
  args = (shared_ptr<WebSocketsession> *)(in_RDI + 0x10);
  handler = (offset_in_WebSocketsession_to_subr *)(in_RDI + 0x20);
  local_48[0].args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
  super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)on_read;
  local_48[0].args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
  super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  handler_00 = local_48;
  CLI::std::enable_shared_from_this<WebSocketsession>::shared_from_this(in_stack_ffffffffffffff88);
  boost::beast::
  bind_front_handler<void(WebSocketsession::*)(boost::system::error_code,unsigned_long),std::shared_ptr<WebSocketsession>>
            (handler,args);
  boost::beast::websocket::
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
  ::
  async_read<boost::beast::basic_flat_buffer<std::allocator<char>_>,_boost::beast::detail::bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>_>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,handler_00);
  boost::beast::detail::
  bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
  ::~bind_front_wrapper
            ((bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
              *)0x2bdf40);
  CLI::std::shared_ptr<WebSocketsession>::~shared_ptr((shared_ptr<WebSocketsession> *)0x2bdf4a);
  return;
}

Assistant:

void do_read()
    {
        // Read a message into our buffer
        ws.async_read(buffer,
                      beast::bind_front_handler(&WebSocketsession::on_read, shared_from_this()));
    }